

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O1

void env_routine_put(Routine r,int line,Environment *env)

{
  Record *pRVar1;
  Record **ppRVar2;
  char *__format;
  
  pRVar1 = env_match(r.name,env);
  if (pRVar1 != (Record *)0x0) {
    __format = 
    "\x1b[31m\n[Runtime Error] [Line:%d] Identifer %s cannot be redefined as a routine in the same scope!\x1b[0m"
    ;
    if ((pRVar1->object).type == OBJECT_ROUTINE) {
      __format = "\x1b[31m\n[Runtime Error] [Line:%d] Routine %s is already defined!\x1b[0m";
    }
    printf(__format,line,r.name);
    stop();
  }
  pRVar1 = (Record *)malloc(0x50);
  pRVar1->name = r.name;
  (pRVar1->object).type = OBJECT_ROUTINE;
  (pRVar1->object).field_1.instance = (Instance *)r._0_8_;
  (pRVar1->object).field_1.routine.name = r.name;
  *(undefined8 *)((long)&(pRVar1->object).field_1 + 0x10) = r._16_8_;
  (pRVar1->object).field_1.routine.arguments = r.arguments;
  *(undefined8 *)((long)&(pRVar1->object).field_1 + 0x20) = r._32_8_;
  *(undefined8 *)((long)&(pRVar1->object).field_1 + 0x28) = r.code._0_8_;
  *(Statement **)((long)&(pRVar1->object).field_1 + 0x30) = r.code.statements;
  pRVar1->next = (Record *)0x0;
  ppRVar2 = &env->rear;
  if (env->front != (Record *)0x0) {
    env = (Environment *)ppRVar2;
    ppRVar2 = &(*ppRVar2)->next;
  }
  *ppRVar2 = pRVar1;
  env->front = pRVar1;
  return;
}

Assistant:

void env_routine_put(Routine r, int line, Environment *env){
    Record *match = env_match(r.name, env);
    if(match != NULL){
        if(match->object.type != OBJECT_ROUTINE){
            printf(runtime_error("Identifer %s cannot be redefined as a routine in the same scope!"), line, r.name);
        }
        else{
            printf(runtime_error("Routine %s is already defined!"), line, r.name);
        }
        stop();
    }

    Object record;
    record.type = OBJECT_ROUTINE;
    record.routine = r;

    rec_new(r.name, record, env);
}